

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O1

NumberFormat *
icu_63::NumberFormat::internalCreateInstance(Locale *loc,UNumberFormatStyle kind,UErrorCode *status)

{
  int32_t iVar1;
  ICULocaleService *pIVar2;
  NumberFormat *pNVar3;
  UErrorCode kvStatus;
  char cfKeyValue [32];
  UErrorCode local_4c;
  long local_48 [4];
  
  if (kind == UNUM_CURRENCY) {
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[0] = 0;
    local_48[1] = 0;
    local_4c = U_ZERO_ERROR;
    iVar1 = Locale::getKeywordValue(loc,"cf",(char *)local_48,0x20,&local_4c);
    kind = UNUM_CURRENCY_ACCOUNTING;
    if (local_48[0] != 0x746e756f636361) {
      kind = UNUM_CURRENCY;
    }
    if (U_ZERO_ERROR < local_4c) {
      kind = UNUM_CURRENCY;
    }
    if (iVar1 < 1) {
      kind = UNUM_CURRENCY;
    }
  }
  if ((gServiceInitOnce.fState.super___atomic_base<int>._M_i != 0) &&
     (pIVar2 = getNumberFormatService(), pIVar2 != (ICULocaleService *)0x0)) {
    pNVar3 = (NumberFormat *)ICULocaleService::get(gService,loc,kind,status);
    return pNVar3;
  }
  pNVar3 = makeInstance(loc,kind,'\0',status);
  return pNVar3;
}

Assistant:

NumberFormat*
NumberFormat::internalCreateInstance(const Locale& loc, UNumberFormatStyle kind, UErrorCode& status) {
    if (kind == UNUM_CURRENCY) {
        char cfKeyValue[kKeyValueLenMax] = {0};
        UErrorCode kvStatus = U_ZERO_ERROR;
        int32_t kLen = loc.getKeywordValue("cf", cfKeyValue, kKeyValueLenMax, kvStatus);
        if (U_SUCCESS(kvStatus) && kLen > 0 && uprv_strcmp(cfKeyValue,"account")==0) {
            kind = UNUM_CURRENCY_ACCOUNTING;
        }
    }
#if !UCONFIG_NO_SERVICE
    if (haveService()) {
        return (NumberFormat*)gService->get(loc, kind, status);
    }
#endif
    return makeInstance(loc, kind, status);
}